

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewind.c
# Opt level: O1

RewindStats * rewind_get_stats(RewindStats *__return_storage_ptr__,RewindBuffer *buffer)

{
  u8 *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  
  lVar6 = 0;
  __return_storage_ptr__->info_ranges[3] = 0;
  __return_storage_ptr__->info_ranges[1] = 0;
  __return_storage_ptr__->info_ranges[2] = 0;
  __return_storage_ptr__->data_ranges[3] = 0;
  __return_storage_ptr__->info_ranges[0] = 0;
  __return_storage_ptr__->data_ranges[1] = 0;
  __return_storage_ptr__->data_ranges[2] = 0;
  __return_storage_ptr__->capacity_bytes = 0;
  __return_storage_ptr__->data_ranges[0] = 0;
  __return_storage_ptr__->uncompressed_bytes = 0;
  __return_storage_ptr__->used_bytes = 0;
  __return_storage_ptr__->base_bytes = 0;
  __return_storage_ptr__->diff_bytes = 0;
  __return_storage_ptr__->base_bytes = buffer->total_kind_bytes[0];
  __return_storage_ptr__->diff_bytes = buffer->total_kind_bytes[1];
  __return_storage_ptr__->uncompressed_bytes = buffer->total_uncompressed_bytes;
  __return_storage_ptr__->used_bytes = 0;
  __return_storage_ptr__->capacity_bytes = (buffer->init).buffer_capacity;
  puVar1 = buffer->data_range[0].begin;
  sVar7 = 0;
  do {
    lVar2 = *(long *)((long)&buffer->data_range[0].begin + lVar6);
    lVar3 = *(long *)((long)&buffer->data_range[0].end + lVar6);
    lVar4 = *(long *)((long)&buffer->info_range[0].end + lVar6);
    lVar5 = *(long *)((long)&buffer->info_range[0].begin + lVar6);
    sVar7 = (sVar7 + lVar4 + (lVar3 - lVar2)) - lVar5;
    *(long *)((long)__return_storage_ptr__->data_ranges + lVar6) = lVar2 - (long)puVar1;
    *(long *)((long)__return_storage_ptr__->data_ranges + lVar6 + 8) = lVar3 - (long)puVar1;
    *(long *)((long)__return_storage_ptr__->info_ranges + lVar6) = lVar5 - (long)puVar1;
    *(long *)((long)__return_storage_ptr__->info_ranges + lVar6 + 8) = lVar4 - (long)puVar1;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 == 0x10);
  __return_storage_ptr__->used_bytes = sVar7;
  return __return_storage_ptr__;
}

Assistant:

RewindStats rewind_get_stats(RewindBuffer* buffer) {
  RewindStats stats;
  ZERO_MEMORY(stats);
  stats.base_bytes = buffer->total_kind_bytes[RewindInfoKind_Base];
  stats.diff_bytes = buffer->total_kind_bytes[RewindInfoKind_Diff];
  stats.uncompressed_bytes = buffer->total_uncompressed_bytes;
  stats.used_bytes = 0;
  stats.capacity_bytes = buffer->init.buffer_capacity;

  u8* begin = buffer->data_range[0].begin;
  int i;
  for (i = 0; i < 2; ++i) {
    RewindDataRange* data_range = &buffer->data_range[i];
    RewindInfoRange* info_range = &buffer->info_range[i];
    stats.used_bytes += data_range->end - data_range->begin;
    stats.used_bytes +=
        (info_range->end - info_range->begin) * sizeof(RewindInfo);

    stats.data_ranges[i*2+0] = data_range->begin - begin;
    stats.data_ranges[i*2+1] = data_range->end - begin;
    stats.info_ranges[i*2+0] = (u8*)info_range->begin - begin;
    stats.info_ranges[i*2+1] = (u8*)info_range->end - begin;
  }

  return stats;
}